

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfsubs.cpp
# Opt level: O3

UBool __thiscall
icu_63::ModulusSubstitution::doParse
          (ModulusSubstitution *this,UnicodeString *text,ParsePosition *parsePosition,
          double baseValue,double upperBound,UBool lenientParse,
          uint32_t nonNumericalExecutedRuleMask,Formattable *result)

{
  UBool UVar1;
  double dVar2;
  double d;
  UErrorCode status;
  UErrorCode local_1c;
  
  if (this->ruleToUse != (NFRule *)0x0) {
    NFRule::doParse(this->ruleToUse,text,parsePosition,'\0',upperBound,nonNumericalExecutedRuleMask,
                    result);
    if (parsePosition->index != 0) {
      local_1c = U_ZERO_ERROR;
      dVar2 = Formattable::getDouble(result,&local_1c);
      (*(this->super_NFSubstitution).super_UObject._vptr_UObject[0xb])(dVar2,baseValue,this);
      Formattable::setDouble(result,d);
    }
    return '\x01';
  }
  UVar1 = NFSubstitution::doParse
                    (&this->super_NFSubstitution,text,parsePosition,baseValue,upperBound,
                     lenientParse,nonNumericalExecutedRuleMask,result);
  return UVar1;
}

Assistant:

UBool
ModulusSubstitution::doParse(const UnicodeString& text,
                             ParsePosition& parsePosition,
                             double baseValue,
                             double upperBound,
                             UBool lenientParse,
                             uint32_t nonNumericalExecutedRuleMask,
                             Formattable& result) const
{
    // if this isn't a >>> substitution, we can just use the
    // inherited parse() routine to do the parsing
    if (ruleToUse == NULL) {
        return NFSubstitution::doParse(text, parsePosition, baseValue, upperBound, lenientParse, nonNumericalExecutedRuleMask, result);

        // but if it IS a >>> substitution, we have to do it here: we
        // use the specific rule's doParse() method, and then we have to
        // do some of the other work of NFRuleSet.parse()
    } else {
        ruleToUse->doParse(text, parsePosition, FALSE, upperBound, nonNumericalExecutedRuleMask, result);

        if (parsePosition.getIndex() != 0) {
            UErrorCode status = U_ZERO_ERROR;
            double tempResult = result.getDouble(status);
            tempResult = composeRuleValue(tempResult, baseValue);
            result.setDouble(tempResult);
        }

        return TRUE;
    }
}